

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::reallocateTo
          (SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *this,
          size_type newCapacity)

{
  DelayedSequenceElementSyntax **__last;
  EVP_PKEY_CTX *ctx;
  DelayedSequenceElementSyntax **in_RSI;
  SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *in_RDI;
  pointer newData;
  
  __last = (DelayedSequenceElementSyntax **)operator_new(0x2f3806);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::
  uninitialized_move<slang::syntax::DelayedSequenceElementSyntax**,slang::syntax::DelayedSequenceElementSyntax**>
            (in_RSI,__last,(DelayedSequenceElementSyntax **)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }